

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex_interface.cpp
# Opt level: O0

void SoPlex_changeUpperReal(void *soplex,double *ub,int dim)

{
  VectorBase<double> *in_RDI;
  SoPlexBase<double> *unaff_retaddr;
  Vector ubvec;
  SoPlex *so;
  double *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  VectorBase<double> *in_stack_ffffffffffffffd0;
  
  ::soplex::VectorBase<double>::VectorBase
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
  ::soplex::SoPlexBase<double>::changeUpperReal(unaff_retaddr,in_RDI);
  ::soplex::VectorBase<double>::~VectorBase((VectorBase<double> *)0x1a69df);
  return;
}

Assistant:

void SoPlex_changeUpperReal(void* soplex, double* ub, int dim)
{
   SoPlex* so = (SoPlex*)(soplex);
   Vector ubvec(dim, ub);
   so->changeUpperReal(ubvec);
}